

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gls::StateChangeCallPerformanceCase::iterate(StateChangeCallPerformanceCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  pointer puVar3;
  undefined4 extraout_var;
  pointer puVar4;
  
  puVar4 = (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 == puVar3) {
    logTestCase(this);
    puVar4 = (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  bVar1 = this->m_iterationCount <= (int)((ulong)((long)puVar3 - (long)puVar4) >> 3);
  if (bVar1) {
    logAndSetTestResult(this);
  }
  else {
    executeTest(this);
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(err,"Unexpected error",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                    ,0x2ce);
  }
  return (uint)!bVar1;
}

Assistant:

tcu::TestCase::IterateResult StateChangeCallPerformanceCase::iterate (void)
{
	if (m_results.empty())
		logTestCase();

	if ((int)m_results.size() < m_iterationCount)
	{
		executeTest();
		GLU_EXPECT_NO_ERROR(m_renderCtx.getFunctions().getError(), "Unexpected error");
		return CONTINUE;
	}
	else
	{
		logAndSetTestResult();
		return STOP;
	}
}